

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test.cc
# Opt level: O0

void __thiscall
JsonTest_EncodeConflictJsonName_Test::~JsonTest_EncodeConflictJsonName_Test
          (JsonTest_EncodeConflictJsonName_Test *this)

{
  JsonTest_EncodeConflictJsonName_Test *this_local;
  
  ~JsonTest_EncodeConflictJsonName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonTest, EncodeConflictJsonName) {
  upb::Arena a;
  upb_test_Box* box = upb_test_Box_new(a.ptr());
  upb_test_Box_set_value(box, 2);
  EXPECT_EQ(R"({"old_value":2})", JsonEncode(box, 0));

  upb_test_Box* new_box = upb_test_Box_new(a.ptr());
  upb_test_Box_set_new_value(new_box, 2);
  EXPECT_EQ(R"({"value":2})", JsonEncode(new_box, 0));
}